

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O0

QAbstractItemModel * createTreeModel(QObject *parent)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QStandardItemModel *pQVar5;
  QVariant local_388;
  undefined1 local_368 [24];
  QVariant local_350;
  undefined1 local_330 [29];
  QLatin1Char local_313;
  QChar local_312;
  QLatin1Char local_30f;
  QChar local_30e;
  QLatin1Char local_30b;
  QChar local_30a;
  QArrayDataPointer<char16_t> local_308;
  QString local_2f0;
  QString local_2d8;
  QString local_2c0;
  QString local_2a8;
  QVariant local_290;
  undefined1 local_270 [24];
  int local_258;
  int local_254;
  int h;
  int k;
  undefined1 local_238 [8];
  QModelIndex parIdx;
  QModelIndex local_200;
  undefined1 local_1e8 [24];
  QVariant local_1d0;
  QModelIndex local_1b0;
  undefined1 local_198 [25];
  QLatin1Char local_17f;
  QChar local_17e;
  QLatin1Char local_17b;
  QChar local_17a;
  QArrayDataPointer<char16_t> local_178;
  QString local_160;
  QString local_148;
  QString local_130;
  QVariant local_118;
  QModelIndex local_f8;
  undefined1 local_e0 [24];
  QModelIndex local_c8;
  int local_ac;
  int j;
  int local_8c;
  int i;
  QModelIndex local_70;
  QStandardItemModel *local_48;
  QAbstractItemModel *result;
  QObject *parent_local;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_28;
  char16_t *local_20;
  char16_t *str_1;
  QArrayDataPointer<char16_t> *local_10;
  
  local_48 = (QStandardItemModel *)0x0;
  result = (QAbstractItemModel *)parent;
  pQVar5 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(pQVar5,(QObject *)result);
  local_48 = pQVar5;
  QModelIndex::QModelIndex(&local_70);
  (**(code **)(*(long *)pQVar5 + 0xf8))(pQVar5,0,5,&local_70);
  pQVar5 = local_48;
  QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffff78);
  (**(code **)(*(long *)pQVar5 + 0x100))(pQVar5,0,3,&stack0xffffffffffffff78);
  local_8c = 0;
  while( true ) {
    pQVar5 = local_48;
    iVar1 = local_8c;
    QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffff58);
    iVar3 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,&stack0xffffffffffffff58);
    if (iVar3 <= iVar1) break;
    local_ac = 0;
    while( true ) {
      pQVar5 = local_48;
      iVar1 = local_ac;
      QModelIndex::QModelIndex(&local_c8);
      iVar4 = (**(code **)(*(long *)pQVar5 + 0x80))(pQVar5,&local_c8);
      pQVar5 = local_48;
      iVar2 = local_8c;
      iVar3 = local_ac;
      if (iVar4 <= iVar1) break;
      QModelIndex::QModelIndex(&local_f8);
      (**(code **)(*(long *)pQVar5 + 0x60))(local_e0,pQVar5,iVar2,iVar3,&local_f8);
      str = L"%1,%2";
      parent_local = (QObject *)anon_var_dwarf_13d85;
      local_28 = &local_178;
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_178,(Data *)0x0,L"%1,%2",5);
      QString::QString(&local_160,&local_178);
      iVar1 = local_8c;
      QLatin1Char::QLatin1Char(&local_17b,' ');
      QChar::QChar(&local_17a,local_17b);
      QString::arg(&local_148,&local_160,iVar1,0,10,local_17a);
      iVar1 = local_ac;
      QLatin1Char::QLatin1Char(&local_17f,' ');
      QChar::QChar(&local_17e,local_17f);
      QString::arg(&local_130,&local_148,iVar1,0,10,local_17e);
      QVariant::QVariant(&local_118,(QString *)&local_130);
      (**(code **)(*(long *)pQVar5 + 0x98))(pQVar5,local_e0,&local_118,2);
      QVariant::~QVariant(&local_118);
      QString::~QString(&local_130);
      QString::~QString(&local_148);
      QString::~QString(&local_160);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
      pQVar5 = local_48;
      iVar3 = local_8c;
      iVar1 = local_ac;
      QModelIndex::QModelIndex(&local_1b0);
      (**(code **)(*(long *)pQVar5 + 0x60))(local_198,pQVar5,iVar3,iVar1,&local_1b0);
      QVariant::QVariant(&local_1d0,local_8c);
      (**(code **)(*(long *)pQVar5 + 0x98))(pQVar5,local_198,&local_1d0,0x100);
      QVariant::~QVariant(&local_1d0);
      pQVar5 = local_48;
      iVar3 = local_8c;
      iVar1 = local_ac;
      QModelIndex::QModelIndex(&local_200);
      (**(code **)(*(long *)pQVar5 + 0x60))(local_1e8,pQVar5,iVar3,iVar1,&local_200);
      QVariant::QVariant((QVariant *)&parIdx.m,local_ac);
      (**(code **)(*(long *)pQVar5 + 0x98))(pQVar5,local_1e8,&parIdx.m,0x101);
      QVariant::~QVariant((QVariant *)&parIdx.m);
      local_ac = local_ac + 1;
    }
    QModelIndex::QModelIndex((QModelIndex *)&h);
    (**(code **)(*(long *)pQVar5 + 0x60))(local_238,pQVar5,iVar2,0,&h);
    (**(code **)(*(long *)local_48 + 0xf8))(local_48,0,5,local_238);
    (**(code **)(*(long *)local_48 + 0x100))(local_48,0,3,local_238);
    local_254 = 0;
    while( true ) {
      iVar1 = local_254;
      iVar3 = (**(code **)(*(long *)local_48 + 0x78))(local_48,local_238);
      if (iVar3 <= iVar1) break;
      local_258 = 0;
      while( true ) {
        iVar1 = local_258;
        iVar3 = (**(code **)(*(long *)local_48 + 0x80))(local_48,local_238);
        pQVar5 = local_48;
        if (iVar3 <= iVar1) break;
        (**(code **)(*(long *)local_48 + 0x60))(local_270,local_48,local_254,local_258,local_238);
        str_1 = L"%1,%2,%3";
        local_20 = L"%1,%2,%3";
        local_10 = &local_308;
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_308,(Data *)0x0,L"%1,%2,%3",8);
        QString::QString(&local_2f0,&local_308);
        iVar1 = local_8c;
        QLatin1Char::QLatin1Char(&local_30b,' ');
        QChar::QChar(&local_30a,local_30b);
        QString::arg(&local_2d8,&local_2f0,iVar1,0,10,local_30a);
        iVar1 = local_254;
        QLatin1Char::QLatin1Char(&local_30f,' ');
        QChar::QChar(&local_30e,local_30f);
        QString::arg(&local_2c0,&local_2d8,iVar1,0,10,local_30e);
        iVar1 = local_258;
        QLatin1Char::QLatin1Char(&local_313,' ');
        QChar::QChar(&local_312,local_313);
        QString::arg(&local_2a8,&local_2c0,iVar1,0,10,local_312);
        QVariant::QVariant(&local_290,(QString *)&local_2a8);
        (**(code **)(*(long *)pQVar5 + 0x98))(pQVar5,local_270,&local_290,2);
        QVariant::~QVariant(&local_290);
        QString::~QString(&local_2a8);
        QString::~QString(&local_2c0);
        QString::~QString(&local_2d8);
        QString::~QString(&local_2f0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_308);
        pQVar5 = local_48;
        (**(code **)(*(long *)local_48 + 0x60))(local_330,local_48,local_254,local_258,local_238);
        QVariant::QVariant(&local_350,local_258);
        (**(code **)(*(long *)pQVar5 + 0x98))(pQVar5,local_330,&local_350,0x100);
        QVariant::~QVariant(&local_350);
        pQVar5 = local_48;
        (**(code **)(*(long *)local_48 + 0x60))(local_368,local_48,local_254,local_258,local_238);
        QVariant::QVariant(&local_388,local_254);
        (**(code **)(*(long *)pQVar5 + 0x98))(pQVar5,local_368,&local_388,0x101);
        QVariant::~QVariant(&local_388);
        local_258 = local_258 + 1;
      }
      local_254 = local_254 + 1;
    }
    local_8c = local_8c + 1;
  }
  return (QAbstractItemModel *)local_48;
}

Assistant:

QAbstractItemModel *createTreeModel(QObject *parent)
{
    QAbstractItemModel *result = nullptr;
#ifdef COMPLEX_MODEL_SUPPORT
    result = new ComplexModel(parent);
    result->insertRows(0, 5);
    result->insertColumns(0, 3);
    for (int i = 0; i < result->rowCount(); ++i) {
        for (int j = 0; j < result->columnCount(); ++j) {
            result->setData(result->index(i, j), QStringLiteral("%1,%2").arg(i).arg(j), Qt::EditRole);
            result->setData(result->index(i, j), i, Qt::UserRole);
            result->setData(result->index(i, j), j, Qt::UserRole + 1);
        }
        const QModelIndex parIdx = result->index(i, 0);
        result->insertRows(0, 5, parIdx);
        result->insertColumns(0, 3, parIdx);
        for (int k = 0; k < result->rowCount(parIdx); ++k) {
            for (int h = 0; h < result->columnCount(parIdx); ++h) {
                result->setData(result->index(k, h, parIdx), QStringLiteral("%1,%2,%3").arg(i).arg(k).arg(h), Qt::EditRole);
                result->setData(result->index(k, h, parIdx), h, Qt::UserRole);
                result->setData(result->index(k, h, parIdx), k, Qt::UserRole + 1);
            }
        }
    }
#endif
    return result;
}